

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_str_attr
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *attr,string *name,uint32_t indent)

{
  char *pcVar1;
  pointer pPVar2;
  Path *v;
  byte bVar3;
  byte bVar4;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  ostream *poVar8;
  ostream *poVar9;
  uint32_t uVar10;
  undefined4 in_register_0000000c;
  pprint *this;
  pointer pPVar11;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar12;
  undefined8 extraout_RDX_01;
  char cVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  string a;
  stringstream ss;
  string local_3c8;
  string *local_3a8;
  undefined4 local_39c;
  byte local_398;
  storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390 [32];
  byte local_370;
  char local_36f;
  TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  string *local_348;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (pprint *)CONCAT44(in_register_0000000c,indent);
  local_3a8 = name;
  local_348 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar7 = (attr->_attrib).has_value_;
  if ((((bVar7 != false) ||
       ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)) || (attr->_value_empty != false)) ||
     (attr->_blocked == true)) {
    pPVar2 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar11 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((pPVar11 == pPVar2 && bVar7 == false) && (attr->_blocked == false)) {
      cVar13 = attr->_value_empty;
    }
    else {
      cVar13 = '\0';
    }
    bVar16 = pPVar11 != pPVar2;
    local_398 = bVar7;
    if ((bVar7 ^ 1U) == 0) {
      nonstd::optional_lite::detail::
      storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::construct_value(local_390,(value_type *)&(attr->_attrib).contained);
    }
    bVar4 = local_370;
    bVar3 = local_398;
    uVar10 = (uint32_t)pPVar11;
    if (local_398 == 1) {
      if (local_368._dirty == true) {
        TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::update(&local_368);
      }
      local_39c = (undefined4)
                  CONCAT71((int7)((ulong)local_368._samples.
                                         super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_finish >> 8),
                           local_368._samples.
                           super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_finish !=
                           local_368._samples.
                           super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    }
    else {
      local_39c = 0;
    }
    if (((local_398 == 1) && (local_36f == '\0')) && (local_370 == 0)) {
      bVar17 = local_368._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_368._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar17 = false;
    }
    bVar6 = AttrMetas::authored(&attr->_metas);
    if (((bVar6) || ((byte)(bVar16 & (bVar7 ^ 1U) | bVar17) != 1)) ||
       (n_01 = n, cVar13 != '\0' || ((bVar3 & bVar4) != 0 || attr->_blocked != false))) {
      pprint::Indent_abi_cxx11_((string *)local_340,this,n);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      pcVar1 = local_340 + 0x10;
      if ((char *)local_340._0_8_ != pcVar1) {
        operator_delete((void *)local_340._0_8_,
                        CONCAT17(local_330[0]._M_local_buf[7],
                                 CONCAT16(local_330[0]._M_local_buf[6],
                                          CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_330[0]._M_allocated_capacity)))
                        + 1);
      }
      local_330[0]._M_allocated_capacity._0_4_ = 0x69727473;
      local_330[0]._M_allocated_capacity._4_2_ = 0x676e;
      local_340._8_8_ = 6;
      local_330[0]._M_local_buf[6] = '\0';
      local_340._0_8_ = pcVar1;
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar1,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(local_3a8->_M_dataplus)._M_p,local_3a8->_M_string_length);
      if ((char *)local_340._0_8_ != pcVar1) {
        operator_delete((void *)local_340._0_8_,
                        CONCAT17(local_330[0]._M_local_buf[7],
                                 CONCAT16(local_330[0]._M_local_buf[6],
                                          CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_330[0]._M_allocated_capacity)))
                        + 1);
      }
      if (attr->_blocked == true) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
      }
      else if (local_398 == 1) {
        local_340._8_8_ = 0;
        local_330[0]._M_allocated_capacity._0_4_ =
             (undefined4)local_330[0]._M_allocated_capacity & 0xffffff00;
        if ((local_36f == '\0') && (local_370 == 1)) {
          local_340._0_8_ = pcVar1;
          ::std::__cxx11::string::_M_assign((string *)local_340);
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
          buildEscapedAndQuotedStringForUSDA(&local_3c8,(string *)local_340);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_340._0_8_ = pcVar1;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = [InternalError]",0x12);
        }
        if ((char *)local_340._0_8_ != pcVar1) {
          operator_delete((void *)local_340._0_8_,
                          CONCAT17(local_330[0]._M_local_buf[7],
                                   CONCAT16(local_330[0]._M_local_buf[6],
                                            CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_330[0]._M_allocated_capacity)
                                           )) + 1);
        }
      }
      bVar7 = AttrMetas::authored(&attr->_metas);
      if (bVar7) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
        print_attr_metas_abi_cxx11_
                  ((string *)local_340,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),uVar10);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
        pprint::Indent_abi_cxx11_(&local_3c8,(pprint *)(ulong)indent,n_00);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_340._0_8_ != pcVar1) {
          operator_delete((void *)local_340._0_8_,
                          CONCAT17(local_330[0]._M_local_buf[7],
                                   CONCAT16(local_330[0]._M_local_buf[6],
                                            CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                                     (undefined4)local_330[0]._M_allocated_capacity)
                                           )) + 1);
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX;
    }
    if ((char)local_39c != '\0') {
      pprint::Indent_abi_cxx11_((string *)local_340,this,n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      pcVar1 = local_340 + 0x10;
      if ((char *)local_340._0_8_ != pcVar1) {
        operator_delete((void *)local_340._0_8_,
                        CONCAT17(local_330[0]._M_local_buf[7],
                                 CONCAT16(local_330[0]._M_local_buf[6],
                                          CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_330[0]._M_allocated_capacity)))
                        + 1);
      }
      local_330[0]._M_allocated_capacity._0_4_ = 0x69727473;
      local_330[0]._M_allocated_capacity._4_2_ = 0x676e;
      local_340._8_8_ = 6;
      local_330[0]._M_local_buf[6] = '\0';
      local_340._0_8_ = pcVar1;
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar1,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(local_3a8->_M_dataplus)._M_p,local_3a8->_M_string_length);
      if ((char *)local_340._0_8_ != pcVar1) {
        operator_delete((void *)local_340._0_8_,
                        CONCAT17(local_330[0]._M_local_buf[7],
                                 CONCAT16(local_330[0]._M_local_buf[6],
                                          CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_330[0]._M_allocated_capacity)))
                        + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
      if (local_398 == 0) {
        __assert_fail("has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                      ,0x584,
                      "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::basic_string<char>>>::value() const [T = tinyusdz::Animatable<std::basic_string<char>>]"
                     );
      }
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_340);
      poVar8 = (ostream *)(local_340 + 0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
      uVar12 = extraout_RDX;
      if (local_368._dirty == true) {
        TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::update(&local_368);
        uVar12 = extraout_RDX_00;
      }
      uVar10 = (uint32_t)uVar12;
      if (local_368._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_368._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar14 = 0;
        uVar15 = 0;
        do {
          pprint::Indent_abi_cxx11_(&local_3c8,(pprint *)(ulong)(indent + 1),(uint32_t)uVar12);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
          poVar9 = ::std::ostream::_M_insert<double>
                             (*(double *)
                               ((long)&(local_368._samples.
                                        super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->t + lVar14));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if ((&(local_368._samples.
                 super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start)->blocked)[lVar14] == true) {
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"None",4);
          }
          else {
            buildEscapedAndQuotedStringForUSDA
                      (&local_3c8,
                       (string *)
                       ((long)&((local_368._samples.
                                 super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->value)._M_dataplus._M_p
                       + lVar14));
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,",\n",2);
          uVar10 = (uint32_t)extraout_RDX_01;
          uVar15 = uVar15 + 1;
          lVar14 = lVar14 + 0x30;
          uVar12 = extraout_RDX_01;
        } while (uVar15 < (ulong)(((long)local_368._samples.
                                         super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_368._samples.
                                         super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 -0x5555555555555555));
      }
      pprint::Indent_abi_cxx11_(&local_3c8,this,uVar10);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      ::std::ios_base::~ios_base(local_2c0);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX_00;
    }
    if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pprint::Indent_abi_cxx11_((string *)local_340,this,n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      pcVar1 = local_340 + 0x10;
      if ((char *)local_340._0_8_ != pcVar1) {
        operator_delete((void *)local_340._0_8_,
                        CONCAT17(local_330[0]._M_local_buf[7],
                                 CONCAT16(local_330[0]._M_local_buf[6],
                                          CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_330[0]._M_allocated_capacity)))
                        + 1);
      }
      local_330[0]._M_allocated_capacity._0_4_ = 0x69727473;
      local_330[0]._M_allocated_capacity._4_2_ = 0x676e;
      local_340._8_8_ = 6;
      local_330[0]._M_local_buf[6] = '\0';
      local_340._0_8_ = pcVar1;
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar1,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(local_3a8->_M_dataplus)._M_p,local_3a8->_M_string_length);
      if ((char *)local_340._0_8_ != pcVar1) {
        operator_delete((void *)local_340._0_8_,
                        CONCAT17(local_330[0]._M_local_buf[7],
                                 CONCAT16(local_330[0]._M_local_buf[6],
                                          CONCAT24(local_330[0]._M_allocated_capacity._4_2_,
                                                   (undefined4)local_330[0]._M_allocated_capacity)))
                        + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
      v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
          .super__Vector_impl_data._M_start;
      lVar14 = ((long)(attr->_paths).
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (lVar14 == 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
      }
      else if (lVar14 == 1) {
        ::std::operator<<(local_1a8,v);
      }
      else {
        ::std::operator<<(local_1a8,&attr->_paths);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    if (local_398 == 1) {
      nonstd::optional_lite::detail::
      storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::destruct_value(local_390);
    }
  }
  psVar5 = local_348;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar5;
}

Assistant:

static std::string print_str_attr(
    const TypedAttribute<Animatable<std::string>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_default " << has_default);

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<std::string>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (pv.has_value()) {

        std::string a;
        if (pv.value().get_scalar(&a)) {
          // Do not use operator<<(std::string)
          ss << " = " << tinyusdz::buildEscapedAndQuotedStringForUSDA(a);
        } else {
          ss << " = [InternalError]";
        }
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<std::string>::type_name() << " " << name;

      ss << ".timeSamples = "
               << print_str_timesamples(pv.value().get_timesamples(), indent);

      ss << "\n";
    }

    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<std::string>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }
  }

  return ss.str();
}